

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdEmuD3D56TexOffset::emulate_mthd(MthdEmuD3D56TexOffset *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  uint uVar2;
  int j;
  long lVar3;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  lVar3 = 0;
  do {
    if (((uint)this->which >> ((uint)lVar3 & 0x1f) & 1) != 0) {
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_offset[lVar3] =
             (this->super_SingleMthdTest).super_MthdTest.val;
        pgraph_celsius_icmd(state,(uint)lVar3,(this->super_SingleMthdTest).super_MthdTest.val,true);
      }
      uVar2 = 0x400000;
      if (lVar3 == 0) {
        uVar2 = 0x4000;
      }
      puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
      *puVar1 = *puVar1 | uVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
       chipset.chipset != 0x10) && (this->which == 3)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[0] = 4;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		for (int j = 0; j < 2; j++) {
			if (which & (1 << j)) {
				if (!extr(exp.nsource, 1, 1)) {
					exp.bundle_tex_offset[j] = val;
					pgraph_celsius_icmd(&exp, j, val, true);
				}
				insrt(exp.valid[1], j ? 22 : 14, 1, 1);
			}
		}
		if (chipset.chipset != 0x10 && which == 3) {
			exp.celsius_pipe_junk[0] = 4;
		}
	}